

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int32_t find_mb_rd_info(MB_RD_RECORD *mb_rd_record,int64_t ref_best_rd,uint32_t hash)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = -1;
  if (ref_best_rd != 0x7fffffffffffffff) {
    iVar3 = 0;
    iVar2 = mb_rd_record->num;
    if (mb_rd_record->num < 1) {
      iVar2 = 0;
    }
    do {
      if (iVar2 == iVar3) {
        return -1;
      }
      iVar1 = (mb_rd_record->index_start + iVar3) % 8;
      iVar3 = iVar3 + 1;
    } while (mb_rd_record->mb_rd_info[iVar1].hash_value != hash);
  }
  return iVar1;
}

Assistant:

static inline int32_t find_mb_rd_info(const MB_RD_RECORD *const mb_rd_record,
                                      const int64_t ref_best_rd,
                                      const uint32_t hash) {
  int32_t match_index = -1;
  if (ref_best_rd != INT64_MAX) {
    for (int i = 0; i < mb_rd_record->num; ++i) {
      const int index = (mb_rd_record->index_start + i) % RD_RECORD_BUFFER_LEN;
      // If there is a match in the mb_rd_record, fetch the RD decision and
      // terminate early.
      if (mb_rd_record->mb_rd_info[index].hash_value == hash) {
        match_index = index;
        break;
      }
    }
  }
  return match_index;
}